

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

void __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::run
          (PolarExtentCoreSimd<xsimd::avx512bw> *this,PolarExtentCoreContext *ctx)

{
  size_t sVar1;
  extent_float_t *peVar2;
  undefined8 uVar3;
  undefined1 auVar4 [64];
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position;
  size_t speaker_idx;
  size_t sVar5;
  PolarExtentCoreContext *mem;
  size_t speaker_idx_1;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [64];
  PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> pos;
  batch<float,_xsimd::avx512bw> local_180;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  sVar1 = ctx->num_speakers;
  position = (PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *)ctx->results;
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    (position->x).super_simd_register<float,_xsimd::avx512bw>.
    super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
    super_simd_register<float,_xsimd::avx512f>.data[sVar5] = 0.0;
  }
  mem = ctx;
  for (uVar8 = 0; uVar8 < ctx->num_points; uVar8 = uVar8 + 0x10) {
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
              ((batch<float,_xsimd::avx512bw> *)(ctx->xs + uVar8),(float *)mem);
    local_140 = in_ZMM0;
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
              ((batch<float,_xsimd::avx512bw> *)(ctx->ys + uVar8),(float *)mem);
    local_100 = in_ZMM0;
    xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
              ((batch<float,_xsimd::avx512bw> *)(ctx->zs + uVar8),(float *)mem);
    local_c0 = in_ZMM0;
    if (ctx->is_circular == true) {
      mem = ctx;
      weight_circle((batch *)this,(PolarExtentCoreSimd<xsimd::avx512bw> *)ctx,
                    (PolarExtentCoreContext *)local_140,position);
      auVar10 = in_ZMM0;
    }
    else {
      mem = ctx;
      weight_stadium((batch *)this,(PolarExtentCoreSimd<xsimd::avx512bw> *)ctx,
                     (PolarExtentCoreContext *)local_140,position);
      auVar10 = in_ZMM0;
    }
    auVar4._8_4_ = 0x3f800000;
    auVar4._0_8_ = 0x3f8000003f800000;
    auVar4._12_4_ = 0x3f800000;
    auVar4._16_4_ = 0x3f800000;
    auVar4._20_4_ = 0x3f800000;
    auVar4._24_4_ = 0x3f800000;
    auVar4._28_4_ = 0x3f800000;
    auVar4._32_4_ = 0x3f800000;
    auVar4._36_4_ = 0x3f800000;
    auVar4._40_4_ = 0x3f800000;
    auVar4._44_4_ = 0x3f800000;
    auVar4._48_4_ = 0x3f800000;
    auVar4._52_4_ = 0x3f800000;
    auVar4._56_4_ = 0x3f800000;
    auVar4._60_4_ = 0x3f800000;
    uVar3 = vcmpps_avx512f(auVar10,auVar4,4);
    in_ZMM0 = auVar10;
    if ((short)uVar3 == 0) {
      lVar7 = 0;
      for (uVar6 = 0; uVar6 < ctx->num_speakers; uVar6 = uVar6 + 0x10) {
        xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
                  ((batch<float,_xsimd::avx512bw> *)
                   ((long)ctx->summed_panning_results + lVar7 + ctx->num_speakers * (uVar8 >> 4) * 4
                   ),(float *)mem);
        peVar2 = ctx->results;
        auVar10 = in_ZMM0;
        xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
                  ((batch<float,_xsimd::avx512bw> *)((long)peVar2 + lVar7),(float *)mem);
        in_ZMM0 = vaddps_avx512f(auVar10,in_ZMM0);
        *(undefined1 (*) [64])((long)peVar2 + lVar7) = in_ZMM0;
        lVar7 = lVar7 + 0x40;
      }
    }
    else {
      uVar3 = vcmpps_avx512f(auVar10,_DAT_001a0d00,4);
      if ((short)uVar3 != 0) {
        for (uVar6 = 0; uVar6 < ctx->real_num_speakers; uVar6 = uVar6 + 1) {
          xsimd::batch<float,_xsimd::avx512bw>::load_aligned<float>
                    ((batch<float,_xsimd::avx512bw> *)
                     (ctx->panning_results + ctx->num_points * uVar6 + uVar8),(float *)mem);
          local_180.super_simd_register<float,_xsimd::avx512bw>.
          super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
          super_simd_register<float,_xsimd::avx512f>.data =
               (simd_register<float,_xsimd::avx512bw>)vmulps_avx512f(in_ZMM0,auVar10);
          fVar9 = xsimd::reduce_add<float,xsimd::avx512bw>(&local_180);
          fVar9 = fVar9 + ctx->results[uVar6];
          in_ZMM0 = ZEXT464((uint)fVar9);
          ctx->results[uVar6] = fVar9;
        }
      }
    }
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }